

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O2

void __thiscall mwheel::DLManager::load_library(DLManager *this,path *library_path)

{
  void *pvVar1;
  char *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  error_loading_dynamic_library *this_00;
  string local_1d0;
  stringstream estream;
  ostream local_1a0 [16];
  void *local_190;
  
  pvVar1 = (void *)dlopen((library_path->m_pathname)._M_dataplus._M_p,1);
  pcVar2 = (char *)dlerror();
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&estream,(string *)library_path);
    local_190 = pvVar1;
    std::
    _Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
    ::_M_emplace_unique<std::pair<boost::filesystem::path,void*>>
              ((_Rb_tree<boost::filesystem::path,std::pair<boost::filesystem::path_const,void*>,std::_Select1st<std::pair<boost::filesystem::path_const,void*>>,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
                *)this,(pair<boost::filesystem::path,_void_*> *)&estream);
    std::__cxx11::string::~string((string *)&estream);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&estream);
  poVar3 = std::operator<<(local_1a0,"ERROR : cannot load shared library ");
  pbVar4 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar3,library_path);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar4);
  poVar3 = std::operator<<(local_1a0,"\t");
  poVar3 = std::operator<<(poVar3,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (error_loading_dynamic_library *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  error_loading_dynamic_library::error_loading_dynamic_library(this_00,&local_1d0);
  __cxa_throw(this_00,&error_loading_dynamic_library::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DLManager::load_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto handle = dlopen(library_path.c_str(), RTLD_LAZY);
  auto error_message = dlerror();
  if (error_message) {
    stringstream estream;
    estream << "ERROR : cannot load shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_loading_dynamic_library(estream.str());
  }
  m_dl_map.insert(make_pair(library_path, handle));
#endif
}